

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_indexes.cpp
# Opt level: O2

void duckdb::DuckDBIndexesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  IndexCatalogEntry *this;
  Catalog *this_00;
  size_type sVar1;
  bool bVar2;
  GlobalTableFunctionState *pGVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  string *psVar6;
  idx_t val;
  long lVar7;
  TableCatalogEntry *pTVar8;
  _func_int **pp_Var9;
  _func_int **__n;
  ulong index;
  string local_188;
  Value local_168;
  string sql;
  LogicalType local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar3 = optional_ptr<duckdb::GlobalTableFunctionState,_true>::operator->(&data_p->global_state);
  __n = pGVar3[4]._vptr_GlobalTableFunctionState;
  pp_Var9 = pGVar3[1]._vptr_GlobalTableFunctionState;
  pp_Var4 = pGVar3[2]._vptr_GlobalTableFunctionState;
  if (__n < (_func_int **)((long)pp_Var4 - (long)pp_Var9 >> 3)) {
    for (index = 0; (__n < (_func_int **)((long)pp_Var4 - (long)pp_Var9 >> 3) && (index < 0x800));
        index = index + 1) {
      pGVar3[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
      pvVar5 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::get<true>
                         ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)(pGVar3 + 1)
                          ,(size_type)__n);
      this = (IndexCatalogEntry *)pvVar5->_M_data;
      psVar6 = Catalog::GetName_abi_cxx11_((this->super_StandardEntry).super_InCatalogEntry.catalog)
      ;
      ::std::__cxx11::string::string((string *)&local_90,(string *)psVar6);
      Value::Value(&local_168,&local_90);
      DataChunk::SetValue(output,0,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::~string((string *)&local_90);
      val = Catalog::GetOid((this->super_StandardEntry).super_InCatalogEntry.catalog);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      Value::BIGINT(&local_168,lVar7);
      DataChunk::SetValue(output,1,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 &(((this->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.
                  name);
      Value::Value(&local_168,&local_b0);
      DataChunk::SetValue(output,2,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::~string((string *)&local_b0);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((((this->super_StandardEntry).schema)->super_InCatalogEntry).
                         super_CatalogEntry.oid);
      Value::BIGINT(&local_168,lVar7);
      DataChunk::SetValue(output,3,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::string
                ((string *)&local_d0,
                 (string *)&(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name
                );
      Value::Value(&local_168,&local_d0);
      DataChunk::SetValue(output,4,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::~string((string *)&local_d0);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid);
      Value::BIGINT(&local_168,lVar7);
      DataChunk::SetValue(output,5,index,&local_168);
      Value::~Value(&local_168);
      this_00 = (((this->super_StandardEntry).schema)->super_InCatalogEntry).catalog;
      (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x10]
      )(&local_168,this);
      (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x11]
      )(&sql,this);
      pTVar8 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                         (this_00,context,(string *)&local_168,&sql,
                          (QueryErrorContext)0xffffffffffffffff);
      ::std::__cxx11::string::~string((string *)&sql);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &(pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
      Value::Value(&local_168,&local_50);
      DataChunk::SetValue(output,6,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::~string((string *)&local_50);
      lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((pTVar8->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.oid);
      Value::BIGINT(&local_168,lVar7);
      DataChunk::SetValue(output,7,index,&local_168);
      Value::~Value(&local_168);
      Value::Value(&local_168,
                   &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.comment);
      DataChunk::SetValue(output,8,index,&local_168);
      Value::~Value(&local_168);
      Value::MAP(&local_168,
                 &(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.tags);
      DataChunk::SetValue(output,9,index,&local_168);
      Value::~Value(&local_168);
      bVar2 = IndexCatalogEntry::IsUnique(this);
      Value::BOOLEAN(&local_168,bVar2);
      DataChunk::SetValue(output,10,index,&local_168);
      Value::~Value(&local_168);
      bVar2 = IndexCatalogEntry::IsPrimary(this);
      Value::BOOLEAN(&local_168,bVar2);
      DataChunk::SetValue(output,0xb,index,&local_168);
      Value::~Value(&local_168);
      GetIndexExpressions((Value *)&sql,this);
      Value::ToString_abi_cxx11_(&local_70,(Value *)&sql);
      Value::Value(&local_168,&local_70);
      DataChunk::SetValue(output,0xc,index,&local_168);
      Value::~Value(&local_168);
      ::std::__cxx11::string::~string((string *)&local_70);
      Value::~Value((Value *)&sql);
      (*(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[10])
                ((Value *)&sql,this);
      sVar1 = sql._M_string_length;
      if (sql._M_string_length == 0) {
        LogicalType::LogicalType(&local_e8,SQLNULL);
        Value::Value(&local_168,&local_e8);
      }
      else {
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sql._M_dataplus._M_p == &sql.field_2) {
          local_188.field_2._8_8_ = sql.field_2._8_8_;
        }
        else {
          local_188._M_dataplus._M_p = sql._M_dataplus._M_p;
        }
        local_188.field_2._M_allocated_capacity._1_7_ = sql.field_2._M_allocated_capacity._1_7_;
        local_188.field_2._M_local_buf[0] = sql.field_2._M_local_buf[0];
        local_188._M_string_length = sql._M_string_length;
        sql._M_string_length = 0;
        sql.field_2._M_local_buf[0] = '\0';
        sql._M_dataplus._M_p = (pointer)&sql.field_2;
        Value::Value(&local_168,&local_188);
      }
      DataChunk::SetValue(output,0xd,index,&local_168);
      Value::~Value(&local_168);
      if (sVar1 == 0) {
        LogicalType::~LogicalType(&local_e8);
      }
      else {
        ::std::__cxx11::string::~string((string *)&local_188);
      }
      ::std::__cxx11::string::~string((string *)&sql);
      __n = pGVar3[4]._vptr_GlobalTableFunctionState;
      pp_Var9 = pGVar3[1]._vptr_GlobalTableFunctionState;
      pp_Var4 = pGVar3[2]._vptr_GlobalTableFunctionState;
    }
    output->count = index;
  }
  return;
}

Assistant:

void DuckDBIndexesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBIndexesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++].get();

		auto &index = entry.Cast<IndexCatalogEntry>();
		// return values:

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, index.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, count, Value(index.schema.name));
		// schema_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.schema.oid)));
		// index_name, VARCHAR
		output.SetValue(col++, count, Value(index.name));
		// index_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(index.oid)));
		// find the table in the catalog
		auto &table_entry =
		    index.schema.catalog.GetEntry<TableCatalogEntry>(context, index.GetSchemaName(), index.GetTableName());
		// table_name, VARCHAR
		output.SetValue(col++, count, Value(table_entry.name));
		// table_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(table_entry.oid)));
		// comment, VARCHAR
		output.SetValue(col++, count, Value(index.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(index.tags));
		// is_unique, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsUnique()));
		// is_primary, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(index.IsPrimary()));
		// expressions, VARCHAR
		output.SetValue(col++, count, GetIndexExpressions(index).ToString());
		// sql, VARCHAR
		auto sql = index.ToSQL();
		output.SetValue(col++, count, sql.empty() ? Value() : Value(std::move(sql)));

		count++;
	}
	output.SetCardinality(count);
}